

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_dechex(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  
  if (nArg < 1) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    pObj = *apArg;
    jx9MemObjToInteger(pObj);
    jx9_result_string_format(pCtx,"%x",(ulong)*(uint *)&pObj->x);
  }
  return 0;
}

Assistant:

static int jx9Builtin_dechex(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iVal;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the given number */
	iVal = jx9_value_to_int(apArg[0]);
	/* Format */
	jx9_result_string_format(pCtx, "%x", iVal);
	return JX9_OK;
}